

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_table_entry.cpp
# Opt level: O1

unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> __thiscall
duckdb::DuckTableEntry::AddColumn(DuckTableEntry *this,ClientContext *context,AddColumnInfo *info)

{
  __node_base *__ht;
  SchemaCatalogEntry *pSVar1;
  __node_base_ptr p_Var2;
  Catalog *catalog;
  bool bVar3;
  CreateTableInfo *this_00;
  pointer pCVar4;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  ColumnDefinition *pCVar6;
  pointer pCVar7;
  Binder *pBVar8;
  LogicalType *type;
  type __args_1;
  reference this_02;
  type __args_3;
  type info_00;
  DuckTableEntry *this_03;
  long in_RCX;
  __node_base_ptr this_04;
  ulong uVar9;
  long lVar10;
  ColumnListIterator CVar11;
  templated_unique_single_t create_info;
  unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
  bound_create_info;
  shared_ptr<duckdb::DataTable,_true> new_storage;
  shared_ptr<duckdb::Binder,_true> binder;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  bound_defaults;
  ColumnDefinition col;
  string col_name;
  _Head_base<0UL,_duckdb::CreateTableInfo_*,_false> local_358;
  undefined1 local_349;
  undefined1 local_348 [16];
  shared_ptr<duckdb::DataTable,_true> local_338;
  ColumnDefinition *local_328;
  __node_base local_320;
  shared_ptr<duckdb::DataTable,_true> local_318;
  undefined1 local_308 [16];
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  local_2f8;
  __node_base local_2e0;
  undefined1 local_2d8 [8];
  pointer local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  __node_base_ptr local_2a0;
  undefined8 uStack_28f;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278 [4];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  a_Stack_238 [56];
  string local_200;
  undefined1 local_1e0 [216];
  undefined1 local_108 [216];
  
  local_328 = (ColumnDefinition *)(in_RCX + 0x78);
  local_320._M_nxt = (_Hash_node_base *)info;
  ColumnDefinition::GetName_abi_cxx11_(&local_200,local_328);
  if ((*(char *)(in_RCX + 0x150) == '\x01') &&
     (bVar3 = ColumnList::ColumnExists
                        ((ColumnList *)&(context->config).asof_loop_join_threshold,&local_200),
     bVar3)) {
    (this->super_TableCatalogEntry).super_StandardEntry.super_InCatalogEntry.super_CatalogEntry.
    _vptr_CatalogEntry = (_func_int **)0x0;
  }
  else {
    pSVar1 = *(SchemaCatalogEntry **)&(context->config).query_verification_enabled;
    local_2e0._M_nxt = (_Hash_node_base *)this;
    this_00 = (CreateTableInfo *)operator_new(0x1d8);
    local_2d8 = (undefined1  [8])&local_2c8;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_2d8,*(long *)&context->interrupted,
               (long)&(((context->registered_state).
                        super_unique_ptr<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
                        ._M_t.
                        super___uniq_ptr_impl<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
                        .super__Head_base<0UL,_duckdb::RegisteredStateManager_*,_false>._M_head_impl
                       )->lock).super___mutex_base._M_mutex + *(long *)&context->interrupted);
    CreateTableInfo::CreateTableInfo(this_00,pSVar1,(string *)local_2d8);
    local_358._M_head_impl = this_00;
    if (local_2d8 != (undefined1  [8])&local_2c8) {
      operator_delete((void *)local_2d8);
    }
    bVar3 = *(bool *)((long)&(context->config).home_directory._M_string_length + 1);
    pCVar4 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
             ::operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                           *)&local_358);
    (pCVar4->super_CreateInfo).temporary = bVar3;
    pCVar4 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
             ::operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                           *)&local_358);
    Value::operator=(&(pCVar4->super_CreateInfo).comment,
                     (Value *)((long)&(context->config).home_directory.field_2 + 8));
    pCVar4 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
             ::operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                           *)&local_358);
    __ht = &(context->config).profiler_settings._M_h._M_before_begin;
    this_01 = &(pCVar4->super_CreateInfo).tags;
    if ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)__ht != this_01) {
      ::std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)this_01,
                 (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)__ht);
    }
    CVar11 = ColumnList::Logical((ColumnList *)&(context->config).asof_loop_join_threshold);
    paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)CVar11.list;
    if (((undefined1  [16])CVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      local_2c8._8_8_ =
           ((long)(*(long *)((long)paVar5 + 8) - paVar5->_M_allocated_capacity) >> 3) *
           -0x7b425ed097b425ed;
    }
    else {
      local_2c8._8_8_ =
           *(long *)(paVar5->_M_local_buf + 0x58) - *(long *)(paVar5->_M_local_buf + 0x50) >> 3;
    }
    local_2d0 = (pointer)CONCAT71(local_2d0._1_7_,CVar11.physical);
    local_2c8._M_allocated_capacity = 0;
    if (((undefined1  [16])CVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      uVar9 = ((long)(*(long *)((long)paVar5 + 8) - paVar5->_M_allocated_capacity) >> 3) *
              -0x7b425ed097b425ed;
    }
    else {
      uVar9 = *(long *)(paVar5->_M_local_buf + 0x58) - *(long *)(paVar5->_M_local_buf + 0x50) >> 3;
    }
    if (((undefined1  [16])CVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      lVar10 = ((long)(*(long *)((long)paVar5 + 8) - paVar5->_M_allocated_capacity) >> 3) *
               -0x7b425ed097b425ed;
    }
    else {
      lVar10 = *(long *)(paVar5->_M_local_buf + 0x58) - *(long *)(paVar5->_M_local_buf + 0x50) >> 3;
    }
    local_2d8 = (undefined1  [8])paVar5;
    if ((uVar9 != 0) || (local_2c8._8_8_ != lVar10)) {
      do {
        pCVar6 = ColumnList::ColumnListIterator::ColumnLogicalIteratorInternal::operator*
                           ((ColumnLogicalIteratorInternal *)local_2d8);
        pCVar4 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                 ::operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                               *)&local_358);
        ColumnDefinition::Copy((ColumnDefinition *)local_108,pCVar6);
        ColumnList::AddColumn(&pCVar4->columns,(ColumnDefinition *)local_108);
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)(local_108 + 0xa0));
        Value::~Value((Value *)(local_108 + 0x60));
        if ((ParsedExpression *)local_108._88_8_ != (ParsedExpression *)0x0) {
          (**(code **)(*(long *)local_108._88_8_ + 8))();
        }
        local_108._88_8_ = (_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)0x0;
        LogicalType::~LogicalType((LogicalType *)(local_108 + 0x20));
        if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
          operator_delete((void *)local_108._0_8_);
        }
        local_2c8._M_allocated_capacity = local_2c8._M_allocated_capacity + 1;
      } while (((local_2c8._M_allocated_capacity != uVar9) || (local_2c8._8_8_ != lVar10)) ||
              (local_2d8 != (undefined1  [8])paVar5));
    }
    this_04 = (__node_base_ptr)(context->config).set_variables._M_h._M_rehash_policy._M_next_resize;
    p_Var2 = (context->config).set_variables._M_h._M_single_bucket;
    if (this_04 != p_Var2) {
      do {
        pCVar4 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                 ::operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                               *)&local_358);
        pCVar7 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                 operator->((unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>
                             *)this_04);
        (*pCVar7->_vptr_Constraint[3])
                  ((unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *)
                   local_2d8,pCVar7);
        ::std::
        vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
                    *)&pCVar4->constraints,
                   (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *)
                   local_2d8);
        if (local_2d8 != (undefined1  [8])0x0) {
          (**(code **)(*(size_type *)local_2d8 + 8))();
        }
        this_04 = this_04 + 1;
      } while (this_04 != p_Var2);
    }
    Binder::CreateBinder
              ((Binder *)local_308,(ClientContext *)local_320._M_nxt,
               (optional_ptr<duckdb::Binder,_true>)0x0,REGULAR_BINDER);
    pBVar8 = shared_ptr<duckdb::Binder,_true>::operator->
                       ((shared_ptr<duckdb::Binder,_true> *)local_308);
    pCVar6 = local_328;
    type = ColumnDefinition::TypeMutable(local_328);
    Binder::BindLogicalType
              (pBVar8,type,(Catalog *)(context->config).max_expression_depth,
               (string *)(*(long *)&(context->config).query_verification_enabled + 0x20));
    ColumnDefinition::SetOid
              (pCVar6,((long)((context->config).streaming_buffer_size -
                             (context->config).asof_loop_join_threshold) >> 3) * -0x7b425ed097b425ed
              );
    ColumnDefinition::SetStorageOid
              (pCVar6,(long)((long)(context->config).set_variables._M_h._M_before_begin._M_nxt -
                            (context->config).set_variables._M_h._M_bucket_count) >> 3);
    ColumnDefinition::Copy((ColumnDefinition *)local_2d8,pCVar6);
    pCVar4 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
             ::operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                           *)&local_358);
    local_1e0._0_8_ = local_1e0 + 0x10;
    if (local_2d8 == (undefined1  [8])&local_2c8) {
      local_1e0._24_8_ = local_2c8._8_8_;
    }
    else {
      local_1e0._0_8_ = local_2d8;
    }
    local_1e0._16_8_ = local_2c8._M_allocated_capacity;
    local_1e0._8_8_ = local_2d0;
    local_2d0 = (pointer)0x0;
    local_2c8._M_allocated_capacity = local_2c8._M_allocated_capacity & 0xffffffffffffff00;
    local_2d8 = (undefined1  [8])&local_2c8;
    LogicalType::LogicalType((LogicalType *)(local_1e0 + 0x20),(LogicalType *)&local_2b8);
    local_1e0._73_8_ = uStack_28f;
    local_1e0._56_8_ = local_2a0;
    local_1e0._88_8_ = local_280._M_head_impl;
    local_280._M_head_impl = (ParsedExpression *)0x0;
    Value::Value((Value *)(local_1e0 + 0x60),(Value *)local_278);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)(local_1e0 + 0xa0),a_Stack_238,a_Stack_238);
    ColumnList::AddColumn(&pCVar4->columns,(ColumnDefinition *)local_1e0);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)(local_1e0 + 0xa0));
    Value::~Value((Value *)(local_1e0 + 0x60));
    if ((BoundParameterMap *)local_1e0._88_8_ != (BoundParameterMap *)0x0) {
      (*(code *)(*(__node_base_ptr *)local_1e0._88_8_)[1]._M_nxt)();
    }
    local_1e0._88_8_ = (BoundParameterMap *)0x0;
    LogicalType::~LogicalType((LogicalType *)(local_1e0 + 0x20));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_1e0 + 0x10)) {
      operator_delete((void *)local_1e0._0_8_);
    }
    local_2f8.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2f8.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2f8.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pBVar8 = shared_ptr<duckdb::Binder,_true>::operator->
                       ((shared_ptr<duckdb::Binder,_true> *)local_308);
    local_348._8_8_ = local_358._M_head_impl;
    local_358._M_head_impl = (CreateTableInfo *)0x0;
    Binder::BindCreateTableInfo
              ((Binder *)local_348,
               (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)
               pBVar8,(SchemaCatalogEntry *)(local_348 + 8),
               *(vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 **)&(context->config).query_verification_enabled);
    if ((CreateTableInfo *)local_348._8_8_ != (CreateTableInfo *)0x0) {
      (*(((CreateInfo *)local_348._8_8_)->super_ParseInfo)._vptr_ParseInfo[1])();
    }
    local_348._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    __args_1 = shared_ptr<duckdb::DataTable,_true>::operator*
                         ((shared_ptr<duckdb::DataTable,_true> *)
                          &(context->config).user_variables._M_h._M_bucket_count);
    this_02 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              ::back(&local_2f8);
    __args_3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(this_02);
    local_338.internal.super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<duckdb::DataTable,std::allocator<duckdb::DataTable>,duckdb::ClientContext&,duckdb::DataTable&,duckdb::ColumnDefinition&,duckdb::Expression&>
              (&local_338.internal.super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,(DataTable **)&local_338,(allocator<duckdb::DataTable> *)&local_349,
               (ClientContext *)local_320._M_nxt,__args_1,local_328,__args_3);
    shared_ptr<duckdb::DataTable,_true>::shared_ptr(&local_318,&local_338.internal);
    if (local_338.internal.super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_338.internal.
                 super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                );
    }
    catalog = (Catalog *)(context->config).max_expression_depth;
    pSVar1 = *(SchemaCatalogEntry **)&(context->config).query_verification_enabled;
    info_00 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
              ::operator*((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                           *)local_348);
    this_03 = (DuckTableEntry *)operator_new(0x298);
    local_338.internal.super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_318.internal.super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_338.internal.super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = local_318.internal.super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (local_318.internal.super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_318.internal.super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_318.internal.super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_318.internal.super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_318.internal.super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    DuckTableEntry(this_03,catalog,pSVar1,info_00,&local_338);
    if (local_338.internal.super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_338.internal.
                 super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                );
    }
    this = (DuckTableEntry *)local_2e0._M_nxt;
    (local_2e0._M_nxt)->_M_nxt = (_Hash_node_base *)this_03;
    if (local_318.internal.super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_318.internal.
                 super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                );
    }
    if ((_Tuple_impl<0UL,_duckdb::BoundCreateTableInfo_*,_std::default_delete<duckdb::BoundCreateTableInfo>_>
         )local_348._0_8_ != (BoundCreateTableInfo *)0x0) {
      ::std::default_delete<duckdb::BoundCreateTableInfo>::operator()
                ((default_delete<duckdb::BoundCreateTableInfo> *)local_348,
                 (BoundCreateTableInfo *)local_348._0_8_);
    }
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)&local_2f8);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(a_Stack_238);
    Value::~Value((Value *)local_278);
    if (local_280._M_head_impl != (ParsedExpression *)0x0) {
      (*(code *)((__node_base_ptr)
                ((local_280._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)[1]._M_nxt)();
    }
    local_280._M_head_impl = (ParsedExpression *)0x0;
    LogicalType::~LogicalType((LogicalType *)&local_2b8);
    if (local_2d8 != (undefined1  [8])&local_2c8) {
      operator_delete((void *)local_2d8);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_308._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_308._8_8_);
    }
    if (local_358._M_head_impl != (CreateTableInfo *)0x0) {
      (*((local_358._M_head_impl)->super_CreateInfo).super_ParseInfo._vptr_ParseInfo[1])();
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p);
  }
  return (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)
         (__uniq_ptr_impl<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)this;
}

Assistant:

unique_ptr<CatalogEntry> DuckTableEntry::AddColumn(ClientContext &context, AddColumnInfo &info) {
	auto col_name = info.new_column.GetName();

	// We're checking for the opposite condition (ADD COLUMN IF _NOT_ EXISTS ...).
	if (info.if_column_not_exists && ColumnExists(col_name)) {
		return nullptr;
	}

	auto create_info = make_uniq<CreateTableInfo>(schema, name);
	create_info->temporary = temporary;
	create_info->comment = comment;
	create_info->tags = tags;

	for (auto &col : columns.Logical()) {
		create_info->columns.AddColumn(col.Copy());
	}
	for (auto &constraint : constraints) {
		create_info->constraints.push_back(constraint->Copy());
	}
	auto binder = Binder::CreateBinder(context);
	binder->BindLogicalType(info.new_column.TypeMutable(), &catalog, schema.name);
	info.new_column.SetOid(columns.LogicalColumnCount());
	info.new_column.SetStorageOid(columns.PhysicalColumnCount());
	auto col = info.new_column.Copy();

	create_info->columns.AddColumn(std::move(col));

	vector<unique_ptr<Expression>> bound_defaults;
	auto bound_create_info = binder->BindCreateTableInfo(std::move(create_info), schema, bound_defaults);
	auto new_storage = make_shared_ptr<DataTable>(context, *storage, info.new_column, *bound_defaults.back());
	return make_uniq<DuckTableEntry>(catalog, schema, *bound_create_info, new_storage);
}